

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFunctionRotation_SQUAD.cpp
# Opt level: O2

void __thiscall
chrono::ChFunctionRotation_SQUAD::ChFunctionRotation_SQUAD(ChFunctionRotation_SQUAD *this)

{
  undefined1 auVar1 [64];
  initializer_list<chrono::ChQuaternion<double>_> __l;
  undefined8 local_88;
  undefined4 local_7c;
  vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_> mrotations;
  undefined1 local_60 [64];
  
  (this->super_ChFunctionRotation)._vptr_ChFunctionRotation =
       (_func_int **)&PTR__ChFunctionRotation_SQUAD_01192f28;
  (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  this->rotations =
       (vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>)
       SUB3224(ZEXT432(0) << 0x40,0);
  (this->knots).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)SUB328(ZEXT432(0) << 0x40,0x18);
  auVar1 = vbroadcastf64x4_avx512f(_QUNIT);
  local_60 = vmovdqu64_avx512f(auVar1);
  __l._M_len = 2;
  __l._M_array = (iterator)local_60;
  std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::vector
            (&mrotations,__l,(allocator_type *)&local_88);
  this->closed = false;
  (*(this->super_ChFunctionRotation)._vptr_ChFunctionRotation[10])(this,&mrotations,0);
  local_7c = 0;
  local_88 = 0x3ff0000000000000;
  std::make_shared<chrono::ChFunction_Ramp,int,double>((int *)local_60,(double *)&local_7c);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->space_fx,
             (__shared_ptr<chrono::ChFunction_Ramp,_(__gnu_cxx::_Lock_policy)2> *)local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  std::_Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::
  ~_Vector_base(&mrotations.
                 super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
               );
  return;
}

Assistant:

ChFunctionRotation_SQUAD::ChFunctionRotation_SQUAD() {
		const std::vector<ChQuaternion<> > mrotations = { QUNIT, QUNIT };
		this->closed = false;
		this->SetupData(mrotations);

		// default s(t) function. User will provide better fx.
		space_fx = chrono_types::make_shared<ChFunction_Ramp>(0, 1.);
	}